

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O0

void __thiscall
YAML::SingleDocParser::HandleFlowSequence(SingleDocParser *this,EventHandler *eventHandler)

{
  bool bVar1;
  Token *pTVar2;
  undefined8 uVar3;
  Token *token;
  EventHandler *in_stack_000000b8;
  SingleDocParser *in_stack_000000c0;
  undefined8 in_stack_fffffffffffffec8;
  value type;
  Scanner *in_stack_fffffffffffffed0;
  string *msg_;
  Mark *in_stack_fffffffffffffed8;
  Mark *mark_;
  Scanner *in_stack_fffffffffffffee0;
  allocator *this_00;
  undefined1 local_d1 [33];
  Token *local_b0;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [32];
  Mark local_80;
  Mark local_70;
  undefined1 local_62;
  allocator local_61;
  string local_60 [32];
  Mark local_40;
  Mark local_20;
  
  Scanner::pop(in_stack_fffffffffffffed0);
  std::unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>::operator->
            ((unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_> *)
             0xf25fdb);
  CollectionStack::PushCollectionType
            ((CollectionStack *)in_stack_fffffffffffffed0,
             (value)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  while( true ) {
    bVar1 = Scanner::empty(in_stack_fffffffffffffed0);
    if (bVar1) {
      local_62 = 1;
      uVar3 = __cxa_allocate_exception(0x40);
      local_40 = Scanner::mark(in_stack_fffffffffffffee0);
      local_20 = local_40;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"end of sequence flow not found",&local_61);
      ParserException::ParserException
                ((ParserException *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                 (string *)in_stack_fffffffffffffed0);
      local_62 = 0;
      __cxa_throw(uVar3,&ParserException::typeinfo,ParserException::~ParserException);
    }
    pTVar2 = Scanner::peek(in_stack_fffffffffffffed0);
    type = (value)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    if (pTVar2->type == FLOW_SEQ_END) break;
    HandleNode(in_stack_000000c0,in_stack_000000b8);
    bVar1 = Scanner::empty(in_stack_fffffffffffffed0);
    if (bVar1) {
      local_a2 = 1;
      uVar3 = __cxa_allocate_exception(0x40);
      local_80 = Scanner::mark(in_stack_fffffffffffffee0);
      this_00 = &local_a1;
      local_70 = local_80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"end of sequence flow not found",this_00);
      ParserException::ParserException
                ((ParserException *)this_00,in_stack_fffffffffffffed8,
                 (string *)in_stack_fffffffffffffed0);
      local_a2 = 0;
      __cxa_throw(uVar3,&ParserException::typeinfo,ParserException::~ParserException);
    }
    local_b0 = Scanner::peek(in_stack_fffffffffffffed0);
    if (local_b0->type == FLOW_ENTRY) {
      Scanner::pop(in_stack_fffffffffffffed0);
    }
    else if (local_b0->type != FLOW_SEQ_END) {
      uVar3 = __cxa_allocate_exception(0x40);
      msg_ = (string *)&local_b0->mark;
      mark_ = (Mark *)local_d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_d1 + 1),"end of sequence flow not found",(allocator *)mark_);
      ParserException::ParserException((ParserException *)in_stack_fffffffffffffee0,mark_,msg_);
      __cxa_throw(uVar3,&ParserException::typeinfo,ParserException::~ParserException);
    }
  }
  Scanner::pop(in_stack_fffffffffffffed0);
  std::unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>::operator->
            ((unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_> *)
             0xf26418);
  CollectionStack::PopCollectionType((CollectionStack *)in_stack_fffffffffffffed0,type);
  return;
}

Assistant:

void SingleDocParser::HandleFlowSequence(EventHandler& eventHandler) {
  // eat start token
  m_scanner.pop();
  m_pCollectionStack->PushCollectionType(CollectionType::FlowSeq);

  while (true) {
    if (m_scanner.empty())
      throw ParserException(m_scanner.mark(), ErrorMsg::END_OF_SEQ_FLOW);

    // first check for end
    if (m_scanner.peek().type == Token::FLOW_SEQ_END) {
      m_scanner.pop();
      break;
    }

    // then read the node
    HandleNode(eventHandler);

    if (m_scanner.empty())
      throw ParserException(m_scanner.mark(), ErrorMsg::END_OF_SEQ_FLOW);

    // now eat the separator (or could be a sequence end, which we ignore - but
    // if it's neither, then it's a bad node)
    Token& token = m_scanner.peek();
    if (token.type == Token::FLOW_ENTRY)
      m_scanner.pop();
    else if (token.type != Token::FLOW_SEQ_END)
      throw ParserException(token.mark, ErrorMsg::END_OF_SEQ_FLOW);
  }

  m_pCollectionStack->PopCollectionType(CollectionType::FlowSeq);
}